

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void websocket_on_unwrapped
               (void *ws_p,void *msg,uint64_t len,char first,char last,char text,uchar rsv)

{
  code *pcVar1;
  ulong uVar2;
  FIOBJ str;
  fiobj_object_vtable_s *pfVar3;
  uint uVar4;
  char cVar5;
  fio_str_info_s ret;
  fio_str_info_s local_58;
  undefined8 local_38;
  uint64_t uStack_30;
  void *local_28;
  
  if (first != '\0' && last != '\0') {
    local_38 = 0;
    uStack_30 = len;
    local_28 = msg;
    (**(code **)((long)ws_p + 0x38))(ws_p,text);
    return;
  }
  if (first != '\0') {
    *(char *)((long)ws_p + 0xb0) = text;
    str = *(FIOBJ *)((long)ws_p + 0xa8);
    if (str == 0) {
      str = fiobj_str_buf(len);
      *(FIOBJ *)((long)ws_p + 0xa8) = str;
    }
    fiobj_str_resize(str,0);
  }
  fiobj_str_write(*(FIOBJ *)((long)ws_p + 0xa8),(char *)msg,len);
  if (last == '\0') {
    return;
  }
  pcVar1 = *(code **)((long)ws_p + 0x38);
  uVar2 = *(ulong *)((long)ws_p + 0xa8);
  if (uVar2 == 0) {
LAB_0015efa5:
    local_58.data = anon_var_dwarf_20c;
    local_58.len._0_4_ = 4;
    goto LAB_0015efb8;
  }
  cVar5 = (char)uVar2;
  if ((uVar2 & 1) != 0) {
    fio_ltocstr(&local_58,(long)uVar2 >> 1);
    goto LAB_0015efbd;
  }
  switch((uint)uVar2 & 6) {
  case 0:
    cVar5 = *(char *)(uVar2 & 0xfffffffffffffff8);
LAB_0015ef3e:
    switch(cVar5) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_0015ef33_caseD_2;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_0015ef33_caseD_4;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_0015ef33_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_0015ef33_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar5 == '&') {
      local_58.data = anon_var_dwarf_217;
      local_58.len._0_4_ = 5;
    }
    else {
      uVar4 = (uint)uVar2 & 0xff;
      if (uVar4 != 0x16) {
        if (uVar4 == 6) goto LAB_0015efa5;
        goto LAB_0015ef3e;
      }
      local_58.data = anon_var_dwarf_222;
      local_58.len._0_4_ = 4;
    }
LAB_0015efb8:
    local_58.capa._0_4_ = 0;
    local_58.capa._4_4_ = 0;
    local_58.len._4_4_ = 0;
    goto LAB_0015efbd;
  }
  (*pfVar3->to_str)(&local_58,uVar2);
LAB_0015efbd:
  (*pcVar1)(ws_p,*(undefined1 *)((long)ws_p + 0xb0));
  return;
}

Assistant:

static void websocket_on_unwrapped(void *ws_p, void *msg, uint64_t len,
                                   char first, char last, char text,
                                   unsigned char rsv) {
  ws_s *ws = ws_p;
  if (last && first) {
    ws->on_message(ws, (fio_str_info_s){.data = msg, .len = len},
                   (uint8_t)text);
    return;
  }
  if (first) {
    ws->is_text = (uint8_t)text;
    if (ws->msg == FIOBJ_INVALID)
      ws->msg = fiobj_str_buf(len);
    fiobj_str_resize(ws->msg, 0);
  }
  fiobj_str_write(ws->msg, msg, len);
  if (last) {
    ws->on_message(ws, fiobj_obj2cstr(ws->msg), ws->is_text);
  }

  (void)rsv;
}